

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O2

int envy_bios_parse_power_fan_calib(envy_bios *bios)

{
  uint8_t *res;
  uint *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  envy_bios_power_fan_calib_entry *peVar5;
  ulong uVar6;
  uint uVar7;
  long lVar8;
  ulong __nmemb;
  
  uVar7 = (bios->power).fan_calib.offset;
  iVar2 = -0x16;
  if (uVar7 != 0) {
    bios_u8(bios,uVar7,&(bios->power).fan_calib.version);
    if ((bios->power).fan_calib.version == '\x10') {
      iVar2 = bios_u8(bios,(bios->power).fan_calib.offset + 1,&(bios->power).fan_calib.hlen);
      iVar3 = bios_u8(bios,(bios->power).fan_calib.offset + 2,&(bios->power).fan_calib.rlen);
      res = &(bios->power).fan_calib.entriesnum;
      iVar4 = bios_u8(bios,(bios->power).fan_calib.offset + 3,res);
      (bios->power).fan_calib.valid = iVar4 == 0 && (iVar3 == 0 && iVar2 == 0);
      __nmemb = (ulong)(bios->power).fan_calib.entriesnum;
      peVar5 = (envy_bios_power_fan_calib_entry *)calloc(__nmemb,0x18);
      (bios->power).fan_calib.entries = peVar5;
      lVar8 = 0;
      for (uVar6 = 0; uVar6 < __nmemb; uVar6 = uVar6 + 1) {
        iVar2 = (uint)(bios->power).fan_calib.hlen + (bios->power).fan_calib.offset;
        iVar3 = (uint)(bios->power).fan_calib.rlen * (int)uVar6;
        uVar7 = iVar2 + iVar3;
        puVar1 = (uint *)((long)&((bios->power).fan_calib.entries)->offset + lVar8);
        *puVar1 = uVar7;
        bios_u8(bios,uVar7,(uint8_t *)(puVar1 + 1));
        bios_u8(bios,iVar3 + iVar2 + 1,&((bios->power).fan_calib.entries)->mode + lVar8);
        bios_u16(bios,iVar3 + iVar2 + 2,
                 (uint16_t *)((long)&((bios->power).fan_calib.entries)->unk02 + lVar8));
        bios_u16(bios,iVar3 + iVar2 + 4,
                 (uint16_t *)((long)&((bios->power).fan_calib.entries)->unk04 + lVar8));
        bios_u16(bios,iVar3 + iVar2 + 6,
                 (uint16_t *)((long)&((bios->power).fan_calib.entries)->unk06 + lVar8));
        bios_u16(bios,iVar3 + iVar2 + 8,
                 (uint16_t *)((long)&((bios->power).fan_calib.entries)->pwm_freq + lVar8));
        bios_u16(bios,iVar3 + iVar2 + 10,
                 (uint16_t *)((long)&((bios->power).fan_calib.entries)->duty_max + lVar8));
        bios_u16(bios,iVar3 + iVar2 + 0xc,
                 (uint16_t *)((long)&((bios->power).fan_calib.entries)->duty_offset + lVar8));
        bios_u16(bios,iVar3 + iVar2 + 0xe,
                 (uint16_t *)((long)&((bios->power).fan_calib.entries)->unk0e + lVar8));
        if (0x11 < (bios->power).fan_calib.rlen) {
          bios_u16(bios,uVar7 + 0x10,
                   (uint16_t *)((long)&((bios->power).fan_calib.entries)->unk10 + lVar8));
          if (0x13 < (bios->power).fan_calib.rlen) {
            bios_u16(bios,uVar7 + 0x12,
                     (uint16_t *)((long)&((bios->power).fan_calib.entries)->unk12 + lVar8));
          }
        }
        __nmemb = (ulong)*res;
        lVar8 = lVar8 + 0x18;
      }
      iVar2 = 0;
    }
    else {
      fprintf(_stderr,"Unknown FAN CALIBRATION table version 0x%x\n");
    }
  }
  return iVar2;
}

Assistant:

int envy_bios_parse_power_fan_calib(struct envy_bios *bios) {
	struct envy_bios_power_fan_calib *fan_calib = &bios->power.fan_calib;
	int i, err = 0;

	if (!fan_calib->offset)
		return -EINVAL;

	bios_u8(bios, fan_calib->offset + 0x0, &fan_calib->version);
	switch(fan_calib->version) {
	case 0x10:
		err |= bios_u8(bios, fan_calib->offset + 0x1, &fan_calib->hlen);
		err |= bios_u8(bios, fan_calib->offset + 0x2, &fan_calib->rlen);
		err |= bios_u8(bios, fan_calib->offset + 0x3, &fan_calib->entriesnum);
		fan_calib->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown FAN CALIBRATION table version 0x%x\n", fan_calib->version);
		return -EINVAL;
	};

	err = 0;
	fan_calib->entries = calloc(fan_calib->entriesnum, sizeof(struct envy_bios_power_fan_calib_entry));
	for (i = 0; i < fan_calib->entriesnum; i++) {
		uint32_t data = fan_calib->offset + fan_calib->hlen + i * fan_calib->rlen;

		fan_calib->entries[i].offset = data;
		bios_u8(bios, data + 0x00, &fan_calib->entries[i].enable);
		bios_u8(bios, data + 0x01, &fan_calib->entries[i].mode);
		bios_u16(bios, data + 0x02, &fan_calib->entries[i].unk02);
		bios_u16(bios, data + 0x04, &fan_calib->entries[i].unk04);
		bios_u16(bios, data + 0x06, &fan_calib->entries[i].unk06);
		bios_u16(bios, data + 0x08, &fan_calib->entries[i].pwm_freq); /* not used by the blob */
		bios_u16(bios, data + 0x0a, &fan_calib->entries[i].duty_max);
		bios_u16(bios, data + 0x0c, (uint16_t*) &fan_calib->entries[i].duty_offset);
		bios_u16(bios, data + 0x0e, &fan_calib->entries[i].unk0e);

		if (fan_calib->rlen >= 0x12)
			bios_u16(bios, data + 0x10, &fan_calib->entries[i].unk10);

		if (fan_calib->rlen >= 0x14)
			bios_u16(bios, data + 0x12, &fan_calib->entries[i].unk12);
	}

	return 0;
}